

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O0

node * node_create(void *data)

{
  node *node;
  void *data_local;
  
  data_local = malloc(0x18);
  if ((undefined8 *)data_local == (undefined8 *)0x0) {
    data_local = (void *)0x0;
  }
  else {
    *(undefined8 *)data_local = 0;
    *(undefined8 *)((long)data_local + 8) = 0;
    *(void **)((long)data_local + 0x10) = data;
  }
  return (node *)data_local;
}

Assistant:

struct node *node_create(const void *data)
{
        struct node *node = malloc(sizeof(struct node));

        if (node == NULL) {
                return NULL;
        }

        node->next = NULL;
        node->previous = NULL;
        node->data = data;

        return node;
}